

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O1

Status sentencepiece::SentencePieceTrainer::Train
                 (string_view args,SentenceIterator *sentence_iterator,
                 string *serialized_model_proto)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  this;
  string *in_R8;
  NormalizerSpec denormalizer_spec;
  NormalizerSpec normalizer_spec;
  TrainerSpec trainer_spec;
  NormalizerSpec local_220;
  NormalizerSpec local_1d0;
  TrainerSpec local_180;
  
  this._M_t.
  super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
  ._M_t.
  super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
  .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl =
       (__uniq_ptr_data<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>,_true,_true>
        )args._M_len;
  iVar1 = logging::GetMinLogLevel();
  if (iVar1 < 1) {
    local_180.super_MessageLite._vptr_MessageLite._0_1_ = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"sentencepiece_trainer.cc",0x18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,0xb2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"LOG(",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"INFO",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Running command: ",0x11);
    if (sentence_iterator == (SentenceIterator *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen((char *)sentence_iterator);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)sentence_iterator,sVar3);
    }
    error::Die::~Die((Die *)&local_180);
  }
  TrainerSpec::TrainerSpec(&local_180,(Arena *)0x0);
  NormalizerSpec::NormalizerSpec(&local_1d0,(Arena *)0x0);
  NormalizerSpec::NormalizerSpec(&local_220,(Arena *)0x0);
  MergeSpecsFromArgs(args,(TrainerSpec *)sentence_iterator,(NormalizerSpec *)&local_180,&local_1d0);
  if (*(long *)this._M_t.
               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl == 0)
  {
    util::Status::~Status
              ((Status *)
               this._M_t.
               super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
               ._M_t.
               super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
               .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl);
    Train((SentencePieceTrainer *)
          this._M_t.
          super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          ._M_t.
          super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
          .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl,&local_180,
          &local_1d0,&local_220,(SentenceIterator *)serialized_model_proto,in_R8);
  }
  NormalizerSpec::~NormalizerSpec(&local_220);
  NormalizerSpec::~NormalizerSpec(&local_1d0);
  TrainerSpec::~TrainerSpec(&local_180);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this._M_t.
             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
             ._M_t.
             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl;
}

Assistant:

util::Status SentencePieceTrainer::Train(absl::string_view args,
                                         SentenceIterator *sentence_iterator,
                                         std::string *serialized_model_proto) {
  LOG(INFO) << "Running command: " << args.data();
  TrainerSpec trainer_spec;
  NormalizerSpec normalizer_spec;
  NormalizerSpec denormalizer_spec;
  RETURN_IF_ERROR(MergeSpecsFromArgs(args, &trainer_spec, &normalizer_spec,
                                     &denormalizer_spec));
  return Train(trainer_spec, normalizer_spec, denormalizer_spec,
               sentence_iterator, serialized_model_proto);
}